

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O3

void __thiscall
sznet::net::TcpConnection::shrinkRSBuffer(TcpConnection *this,size_t sendSize,size_t recvSize)

{
  EventLoop *this_00;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this_00 = this->m_loop;
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = operator_new(0x28);
  *(code **)local_50._M_unused._0_8_ = shrinkRSBufferInLoop;
  *(undefined8 *)((long)local_50._M_unused._0_8_ + 8) = 0;
  *(size_t *)((long)local_50._M_unused._0_8_ + 0x10) = recvSize;
  *(size_t *)((long)local_50._M_unused._0_8_ + 0x18) = sendSize;
  local_38 = std::
             _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*,_unsigned_long,_unsigned_long))(unsigned_long,_unsigned_long)>_>
             ::_M_invoke;
  *(TcpConnection **)((long)local_50._M_unused._0_8_ + 0x20) = this;
  local_40 = std::
             _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*,_unsigned_long,_unsigned_long))(unsigned_long,_unsigned_long)>_>
             ::_M_manager;
  EventLoop::runInLoop(this_00,(Functor *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return;
}

Assistant:

void TcpConnection::shrinkRSBuffer(size_t sendSize, size_t recvSize)
{
	m_loop->runInLoop(std::bind(&TcpConnection::shrinkRSBufferInLoop, this, sendSize, recvSize));
}